

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O2

void __thiscall duckdb::DataChunk::Fuse(DataChunk *this,DataChunk *other)

{
  pointer pVVar1;
  pointer pVVar2;
  reference __args;
  reference __args_00;
  idx_t col_idx;
  size_type __n;
  
  pVVar1 = (other->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar2 = (other->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (__n = 0; ((long)pVVar1 - (long)pVVar2) / 0x68 != __n; __n = __n + 1) {
    __args = vector<duckdb::Vector,_true>::get<true>(&other->data,__n);
    ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::emplace_back<duckdb::Vector>
              ((vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *)this,__args);
    __args_00 = vector<duckdb::VectorCache,_true>::get<true>(&other->vector_caches,__n);
    ::std::vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>::
    emplace_back<duckdb::VectorCache>
              (&(this->vector_caches).
                super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>,__args_00);
  }
  Destroy(other);
  return;
}

Assistant:

void DataChunk::Fuse(DataChunk &other) {
	D_ASSERT(other.size() == size());
	const idx_t num_cols = other.data.size();
	for (idx_t col_idx = 0; col_idx < num_cols; ++col_idx) {
		data.emplace_back(std::move(other.data[col_idx]));
		vector_caches.emplace_back(std::move(other.vector_caches[col_idx]));
	}
	other.Destroy();
}